

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O3

int wally_addr_segwit_from_bytes
              (uchar *bytes,size_t bytes_len,char *addr_family,uint32_t flags,char **output)

{
  size_t sVar1;
  uchar uVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  uint32_t uVar6;
  char *pcVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  byte *pbVar12;
  byte bVar13;
  byte *pbVar14;
  size_t push_size;
  uint8_t data [65];
  char result [90];
  size_t local_f8;
  size_t local_f0;
  byte local_e8 [80];
  byte local_98 [104];
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar10 = -2;
  if ((((output != (char **)0x0) && (bytes_len != 0)) && (bytes != (uchar *)0x0)) &&
     ((addr_family != (char *)0x0 && (flags == 0)))) {
    uVar2 = *bytes;
    if (uVar2 == '\0') {
      bVar13 = 0;
    }
    else {
      if (0xf < (byte)(uVar2 + 0xaf)) {
        return -2;
      }
      bVar13 = uVar2 + 0xb0;
    }
    iVar5 = script_get_push_size_from_bytes(bytes + 1,bytes_len - 1,&local_f8);
    if ((iVar5 == 0) && (((bVar13 != 0 || (local_f8 == 0x20)) || (local_f8 == 0x14)))) {
      local_98[0] = 0;
      sVar1 = bytes_len - 2;
      local_f0 = 0;
      if ((bytes_len - 0x2b < 0xffffffffffffffd9) ||
         ((sVar1 != 0x14 && sVar1 != 0x20) && bVar13 == 0)) {
        wally_clear_2(local_e8,0x41,bytes + 2,sVar1);
      }
      else {
        local_e8[0] = bVar13;
        convert_bits((uint8_t *)((long)local_e8 + 1),&local_f0,5,bytes + 2,sVar1,8,1);
        sVar1 = local_f0;
        uVar6 = 1;
        lVar11 = 0;
        bVar9 = *addr_family;
        bVar3 = bVar9;
        while (bVar3 != 0) {
          if (((byte)(bVar3 + 0x81) < 0xa2) || ((byte)(bVar3 + 0xbf) < 0x1a)) goto LAB_00103375;
          uVar6 = bech32_polymod_step(uVar6);
          uVar6 = bVar3 >> 5 ^ uVar6;
          lVar4 = lVar11 + 1;
          lVar11 = lVar11 + 1;
          bVar3 = addr_family[lVar4];
        }
        if (sVar1 + lVar11 + 8 < 0x5b) {
          uVar6 = bech32_polymod_step(uVar6);
          if (bVar9 == 0) {
            pbVar12 = local_98;
          }
          else {
            pbVar14 = (byte *)(addr_family + 1);
            pbVar12 = local_98;
            do {
              uVar6 = bech32_polymod_step(uVar6);
              *pbVar12 = bVar9;
              uVar6 = bVar9 & 0x1f ^ uVar6;
              pbVar12 = pbVar12 + 1;
              bVar9 = *pbVar14;
              pbVar14 = pbVar14 + 1;
            } while (bVar9 != 0);
          }
          *pbVar12 = 0x31;
          pbVar12 = pbVar12 + 1;
          if (sVar1 != 0xffffffffffffffff) {
            lVar11 = 0;
            do {
              bVar9 = local_e8[lVar11];
              if (0x1f < bVar9) goto LAB_00103375;
              uVar6 = bech32_polymod_step(uVar6);
              uVar6 = uVar6 ^ bVar9;
              pbVar12[lVar11] = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[bVar9];
              lVar11 = lVar11 + 1;
            } while (sVar1 + 1 != lVar11);
            pbVar12 = pbVar12 + lVar11;
          }
          lVar11 = 6;
          do {
            uVar6 = bech32_polymod_step(uVar6);
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
          uVar8 = 0x2bc830a3;
          if (bVar13 == 0) {
            uVar8 = 1;
          }
          bVar13 = 0x19;
          lVar11 = 0;
          do {
            pbVar12[lVar11] =
                 "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[(uVar6 ^ uVar8) >> (bVar13 & 0x1f) & 0x1f];
            lVar11 = lVar11 + 1;
            bVar13 = bVar13 - 5;
          } while (lVar11 != 6);
          pbVar12[6] = 0;
          pcVar7 = wally_strdup((char *)local_98);
          *output = pcVar7;
          wally_clear(local_98,0x5a);
          return (uint)(*output != (char *)0x0) * 3 + -3;
        }
      }
LAB_00103375:
      iVar10 = -1;
    }
  }
  return iVar10;
}

Assistant:

int wally_addr_segwit_from_bytes(const unsigned char *bytes, size_t bytes_len,
                                 const char *addr_family, uint32_t flags,
                                 char **output)
{
    char result[90];
    size_t push_size;
    int ret;
    uint8_t witness_version;

    if (output)
        *output = 0;

    if (!addr_family || flags || !bytes || !bytes_len || !output)
        return WALLY_EINVAL;

    if (bytes[0] == 0)
        witness_version = 0;
    else if (bytes[0] >= OP_1 && bytes[0] <= OP_16)
        witness_version = bytes[0] - (OP_1 - 1);
    else
        return WALLY_EINVAL;

    ret = script_get_push_size_from_bytes(bytes + 1, bytes_len - 1, &push_size);
    if (ret != WALLY_OK)
        return WALLY_EINVAL;
    else if (witness_version == 0 && push_size != HASH160_LEN && push_size != SHA256_LEN)
        return WALLY_EINVAL;

    result[0] = '\0';
    if (!segwit_addr_encode(result, addr_family, witness_version, bytes + 2, bytes_len - 2))
        return WALLY_ERROR;

    *output = wally_strdup(result);
    wally_clear(result, sizeof(result));
    return *output ? WALLY_OK : WALLY_ENOMEM;
}